

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_fmax_a_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int iVar1;
  float32 fVar2;
  float32 fVar3;
  uint uVar4;
  float32 fVar5;
  int iVar6;
  fpr_t *pfVar7;
  fpr_t *pfVar8;
  float64 fVar9;
  float64 fVar10;
  float64 fVar11;
  float_status *pfVar12;
  uintptr_t unaff_retaddr;
  uint64_t local_290;
  wr_t *local_280;
  float32 local_26c;
  float32 local_264;
  float32 local_25c;
  float32 local_254;
  int c_17;
  float_status *status_18;
  int c_16;
  float_status *status_17;
  int c_15;
  float_status *status_16;
  uint64_t xd_5;
  uint64_t xt_5;
  uint64_t xs_5;
  uint64_t at_5;
  uint64_t as_5;
  uint64_t T_5;
  uint64_t S_5;
  int c_14;
  float_status *status_15;
  int c_13;
  float_status *status_14;
  int c_12;
  float_status *status_13;
  uint64_t xd_4;
  uint64_t xt_4;
  uint64_t xs_4;
  uint64_t at_4;
  uint64_t as_4;
  uint64_t T_4;
  uint64_t S_4;
  int c_11;
  float_status *status_12;
  int c_10;
  float_status *status_11;
  int c_9;
  float_status *status_10;
  uint32_t xd_3;
  uint32_t xt_3;
  uint32_t xs_3;
  uint32_t at_3;
  uint32_t as_3;
  uint32_t T_3;
  uint32_t S_3;
  int c_8;
  float_status *status_9;
  int c_7;
  float_status *status_8;
  int c_6;
  float_status *status_7;
  uint32_t xd_2;
  uint32_t xt_2;
  uint32_t xs_2;
  uint32_t at_2;
  uint32_t as_2;
  uint32_t T_2;
  uint32_t S_2;
  int c_5;
  float_status *status_6;
  int c_4;
  float_status *status_5;
  int c_3;
  float_status *status_4;
  uint32_t xd_1;
  uint32_t xt_1;
  uint32_t xs_1;
  uint32_t at_1;
  uint32_t as_1;
  uint32_t T_1;
  uint32_t S_1;
  int c_2;
  float_status *status_3;
  int c_1;
  float_status *status_2;
  int c;
  float_status *status_1;
  float32 local_70;
  uint32_t xd;
  uint32_t xt;
  uint32_t xs;
  uint32_t at;
  uint32_t as;
  uint32_t T;
  uint32_t S;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  wr_t *pwx;
  wr_t wx;
  float_status *status;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState_conflict10 *env_local;
  
  wx.d[1] = (int64_t)&(env->active_tc).msa_fp_status;
  pfVar7 = (env->active_fpu).fpr + ws;
  pfVar8 = (env->active_fpu).fpr + wt;
  status._0_4_ = wt;
  status._4_4_ = ws;
  wt_local = wd;
  ws_local = df;
  _wd_local = env;
  clear_msacsr_cause(env);
  if (ws_local == 2) {
    as = pfVar7->fs[0];
    fVar2 = pfVar8->fs[0];
    iVar1 = float32_is_any_nan(as);
    if ((((iVar1 != 0) ||
         (iVar1 = float32_is_quiet_nan_mips64el(fVar2,(float_status *)wx.d[1]), at = as, iVar1 == 0)
         ) && (iVar1 = float32_is_any_nan(fVar2), at = fVar2, iVar1 == 0)) &&
       (iVar1 = float32_is_quiet_nan_mips64el(as,(float_status *)wx.d[1]), iVar1 != 0)) {
      as = fVar2;
    }
    fVar2 = float32_abs(as);
    fVar3 = float32_abs(at);
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    xd = float32_max_mips64el(as,at,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      xd = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    local_70 = float32_min_mips64el(as,at,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      local_70 = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    status_1._4_4_ = float32_max_mips64el(fVar2,fVar3,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      status_1._4_4_ = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    if ((fVar2 == fVar3) || (fVar2 = float32_abs(xd), status_1._4_4_ == fVar2)) {
      local_254 = xd;
    }
    else {
      local_254 = local_70;
    }
    pwx = (wr_t *)CONCAT44(pwx._4_4_,local_254);
    as_1 = pfVar7->fs[1];
    fVar2 = pfVar8->fs[1];
    iVar1 = float32_is_any_nan(as_1);
    if (((iVar1 != 0) ||
        (iVar1 = float32_is_quiet_nan_mips64el(fVar2,(float_status *)wx.d[1]), at_1 = as_1,
        iVar1 == 0)) &&
       ((iVar1 = float32_is_any_nan(fVar2), at_1 = fVar2, iVar1 == 0 &&
        (iVar1 = float32_is_quiet_nan_mips64el(as_1,(float_status *)wx.d[1]), iVar1 != 0)))) {
      as_1 = fVar2;
    }
    fVar2 = float32_abs(as_1);
    fVar3 = float32_abs(at_1);
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    xd_1 = float32_max_mips64el(as_1,at_1,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      xd_1 = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    status_4._4_4_ = float32_min_mips64el(as_1,at_1,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      status_4._4_4_ = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    status_4._0_4_ = float32_max_mips64el(fVar2,fVar3,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      status_4._0_4_ = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    if ((fVar2 == fVar3) || (fVar2 = float32_abs(xd_1), (float32)status_4 == fVar2)) {
      local_25c = xd_1;
    }
    else {
      local_25c = status_4._4_4_;
    }
    pwx = (wr_t *)CONCAT44(local_25c,pwx._0_4_);
    as_2 = (uint32_t)(&pfVar7->fd)[1];
    fVar2 = (float32)(&pfVar8->fd)[1];
    iVar1 = float32_is_any_nan(as_2);
    if ((((iVar1 != 0) ||
         (iVar1 = float32_is_quiet_nan_mips64el(fVar2,(float_status *)wx.d[1]), at_2 = as_2,
         iVar1 == 0)) && (iVar1 = float32_is_any_nan(fVar2), at_2 = fVar2, iVar1 == 0)) &&
       (iVar1 = float32_is_quiet_nan_mips64el(as_2,(float_status *)wx.d[1]), iVar1 != 0)) {
      as_2 = fVar2;
    }
    fVar2 = float32_abs(as_2);
    fVar3 = float32_abs(at_2);
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    xd_2 = float32_max_mips64el(as_2,at_2,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      xd_2 = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    status_7._4_4_ = float32_min_mips64el(as_2,at_2,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      status_7._4_4_ = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    status_7._0_4_ = float32_max_mips64el(fVar2,fVar3,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      status_7._0_4_ = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    if ((fVar2 == fVar3) || (fVar2 = float32_abs(xd_2), (float32)status_7 == fVar2)) {
      local_264 = xd_2;
    }
    else {
      local_264 = status_7._4_4_;
    }
    wx.w[0] = local_264;
    as_3 = pfVar7->fs[3];
    fVar2 = pfVar8->fs[3];
    iVar1 = float32_is_any_nan(as_3);
    if (((iVar1 != 0) ||
        (iVar1 = float32_is_quiet_nan_mips64el(fVar2,(float_status *)wx.d[1]), at_3 = as_3,
        iVar1 == 0)) &&
       ((iVar1 = float32_is_any_nan(fVar2), at_3 = fVar2, iVar1 == 0 &&
        (iVar1 = float32_is_quiet_nan_mips64el(as_3,(float_status *)wx.d[1]), iVar1 != 0)))) {
      as_3 = fVar2;
    }
    fVar2 = float32_abs(as_3);
    fVar3 = float32_abs(at_3);
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    xd_3 = float32_max_mips64el(as_3,at_3,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      xd_3 = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    status_10._4_4_ = float32_min_mips64el(as_3,at_3,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      status_10._4_4_ = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    status_10._0_4_ = float32_max_mips64el(fVar2,fVar3,pfVar12);
    uVar4 = update_msacsr(_wd_local,0,0);
    iVar1 = get_enabled_exceptions(_wd_local,uVar4);
    if (iVar1 != 0) {
      fVar5 = float32_default_nan_mips64el(pfVar12);
      status_10._0_4_ = (fVar5 ^ 0x400020) & 0xffffffc0 | uVar4;
    }
    if ((fVar2 == fVar3) || (fVar2 = float32_abs(xd_3), (float32)status_10 == fVar2)) {
      local_26c = xd_3;
    }
    else {
      local_26c = status_10._4_4_;
    }
    wx.w[1] = local_26c;
  }
  else {
    if (ws_local != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1ada,
                    "void helper_msa_fmax_a_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    T_4 = pfVar7->fd;
    fVar9 = pfVar8->fd;
    iVar1 = float64_is_any_nan(T_4);
    if ((((iVar1 != 0) ||
         (iVar1 = float64_is_quiet_nan_mips64el(fVar9,(float_status *)wx.d[1]), as_4 = T_4,
         iVar1 == 0)) && (iVar1 = float64_is_any_nan(fVar9), as_4 = fVar9, iVar1 == 0)) &&
       (iVar1 = float64_is_quiet_nan_mips64el(T_4,(float_status *)wx.d[1]), iVar1 != 0)) {
      T_4 = fVar9;
    }
    fVar9 = float64_abs(T_4);
    fVar10 = float64_abs(as_4);
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    xt_4 = float64_max_mips64el(T_4,as_4,pfVar12);
    iVar1 = update_msacsr(_wd_local,0,0);
    iVar6 = get_enabled_exceptions(_wd_local,iVar1);
    if (iVar6 != 0) {
      fVar11 = float64_default_nan_mips64el(pfVar12);
      xt_4 = (fVar11 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    xd_4 = float64_min_mips64el(T_4,as_4,pfVar12);
    iVar1 = update_msacsr(_wd_local,0,0);
    iVar6 = get_enabled_exceptions(_wd_local,iVar1);
    if (iVar6 != 0) {
      fVar11 = float64_default_nan_mips64el(pfVar12);
      xd_4 = (fVar11 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    status_13 = (float_status *)float64_max_mips64el(fVar9,fVar10,pfVar12);
    iVar1 = update_msacsr(_wd_local,0,0);
    iVar6 = get_enabled_exceptions(_wd_local,iVar1);
    if (iVar6 != 0) {
      fVar11 = float64_default_nan_mips64el(pfVar12);
      status_13 = (float_status *)((fVar11 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1);
    }
    if ((fVar9 == fVar10) || (pfVar12 = (float_status *)float64_abs(xt_4), status_13 == pfVar12)) {
      local_280 = (wr_t *)xt_4;
    }
    else {
      local_280 = (wr_t *)xd_4;
    }
    pwx = local_280;
    T_5 = (&pfVar7->fd)[1];
    fVar9 = (&pfVar8->fd)[1];
    iVar1 = float64_is_any_nan(T_5);
    if (((iVar1 != 0) ||
        (iVar1 = float64_is_quiet_nan_mips64el(fVar9,(float_status *)wx.d[1]), as_5 = T_5,
        iVar1 == 0)) &&
       ((iVar1 = float64_is_any_nan(fVar9), as_5 = fVar9, iVar1 == 0 &&
        (iVar1 = float64_is_quiet_nan_mips64el(T_5,(float_status *)wx.d[1]), iVar1 != 0)))) {
      T_5 = fVar9;
    }
    fVar9 = float64_abs(T_5);
    fVar10 = float64_abs(as_5);
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    xt_5 = float64_max_mips64el(T_5,as_5,pfVar12);
    iVar1 = update_msacsr(_wd_local,0,0);
    iVar6 = get_enabled_exceptions(_wd_local,iVar1);
    if (iVar6 != 0) {
      fVar11 = float64_default_nan_mips64el(pfVar12);
      xt_5 = (fVar11 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    xd_5 = float64_min_mips64el(T_5,as_5,pfVar12);
    iVar1 = update_msacsr(_wd_local,0,0);
    iVar6 = get_enabled_exceptions(_wd_local,iVar1);
    if (iVar6 != 0) {
      fVar11 = float64_default_nan_mips64el(pfVar12);
      xd_5 = (fVar11 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1;
    }
    pfVar12 = &(_wd_local->active_tc).msa_fp_status;
    set_float_exception_flags(0,pfVar12);
    status_16 = (float_status *)float64_max_mips64el(fVar9,fVar10,pfVar12);
    iVar1 = update_msacsr(_wd_local,0,0);
    iVar6 = get_enabled_exceptions(_wd_local,iVar1);
    if (iVar6 != 0) {
      fVar11 = float64_default_nan_mips64el(pfVar12);
      status_16 = (float_status *)((fVar11 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1);
    }
    if ((fVar9 == fVar10) || (pfVar12 = (float_status *)float64_abs(xt_5), status_16 == pfVar12)) {
      local_290 = xt_5;
    }
    else {
      local_290 = xd_5;
    }
    wx.d[0] = local_290;
  }
  check_msacsr_cause(_wd_local,unaff_retaddr);
  msa_move_v((wr_t *)((env->active_fpu).fpr + wd),(wr_t *)&pwx);
  return;
}

Assistant:

void helper_msa_fmax_a_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    float_status *status = &env->active_tc.msa_fp_status;
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    clear_msacsr_cause(env);

    if (df == DF_WORD) {
        FMAXMIN_A(max, min, pwx->w[0], pws->w[0], pwt->w[0], 32, status);
        FMAXMIN_A(max, min, pwx->w[1], pws->w[1], pwt->w[1], 32, status);
        FMAXMIN_A(max, min, pwx->w[2], pws->w[2], pwt->w[2], 32, status);
        FMAXMIN_A(max, min, pwx->w[3], pws->w[3], pwt->w[3], 32, status);
    } else if (df == DF_DOUBLE) {
        FMAXMIN_A(max, min, pwx->d[0], pws->d[0], pwt->d[0], 64, status);
        FMAXMIN_A(max, min, pwx->d[1], pws->d[1], pwt->d[1], 64, status);
    } else {
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}